

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorscreen.cpp
# Opt level: O2

void __thiscall
QEglFSEmulatorScreen::initFromJsonObject(QEglFSEmulatorScreen *this,QJsonObject *description)

{
  qsizetype qVar1;
  double dVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Format FVar8;
  ScreenOrientation SVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QJsonObject geometryObject;
  QArrayDataPointer<char16_t> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  QJsonValue::QJsonValue((QJsonValue *)&local_58,Null);
  QVar10.m_data = (char *)description;
  QVar10.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar10);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      uVar6 = QJsonValue::toInt((int)&local_58);
      this->m_id = uVar6;
    }
  }
  QVar11.m_data = (char *)description;
  QVar11.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar11);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isString((QJsonValue *)&local_58);
    if (bVar5) {
      QJsonValue::toString();
      pDVar3 = (this->m_description).d.d;
      pcVar4 = (this->m_description).d.ptr;
      (this->m_description).d.d = local_78.d;
      (this->m_description).d.ptr = local_78.ptr;
      qVar1 = (this->m_description).d.size;
      (this->m_description).d.size = local_78.size;
      local_78.d = pDVar3;
      local_78.ptr = pcVar4;
      local_78.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
  }
  QVar12.m_data = (char *)description;
  QVar12.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar12);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isObject((QJsonValue *)&local_58);
    if (bVar5) {
      _geometryObject = 0xaaaaaaaaaaaaaaaa;
      QJsonValue::toObject();
      QVar13.m_data = (char *)&geometryObject;
      QVar13.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar13);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).x1.m_i = iVar7;
        }
      }
      QVar14.m_data = (char *)&geometryObject;
      QVar14.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar14);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).y1.m_i = iVar7;
        }
      }
      QVar15.m_data = (char *)&geometryObject;
      QVar15.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar15);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).x2.m_i = iVar7 + (this->m_geometry).x1.m_i + -1;
        }
      }
      QVar16.m_data = (char *)&geometryObject;
      QVar16.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar16);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_geometry).y2.m_i = iVar7 + (this->m_geometry).y1.m_i + -1;
        }
      }
      QJsonObject::~QJsonObject(&geometryObject);
    }
  }
  QVar17.m_data = (char *)description;
  QVar17.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar17);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      iVar7 = QJsonValue::toInt((int)&local_58);
      this->m_depth = iVar7;
    }
  }
  QVar18.m_data = (char *)description;
  QVar18.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar18);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      FVar8 = QJsonValue::toInt((int)&local_58);
      this->m_format = FVar8;
    }
  }
  QVar19.m_data = (char *)description;
  QVar19.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar19);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isObject((QJsonValue *)&local_58);
    if (bVar5) {
      _geometryObject = 0xaaaaaaaaaaaaaaaa;
      QJsonValue::toObject();
      QVar20.m_data = (char *)&geometryObject;
      QVar20.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar20);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_physicalSize).wd = (double)iVar7;
        }
      }
      QVar21.m_data = (char *)&geometryObject;
      QVar21.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar21);
      QJsonValue::swap((QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
      if (!bVar5) {
        bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
        if (bVar5) {
          iVar7 = QJsonValue::toInt((int)&local_58);
          (this->m_physicalSize).ht = (double)iVar7;
        }
      }
      QJsonObject::~QJsonObject(&geometryObject);
    }
  }
  QVar22.m_data = (char *)description;
  QVar22.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar22);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      dVar2 = (double)QJsonValue::toDouble(0.0);
      this->m_refreshRate = (float)dVar2;
    }
  }
  QVar23.m_data = (char *)description;
  QVar23.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar23);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      SVar9 = QJsonValue::toInt((int)&local_58);
      this->m_nativeOrientation = SVar9;
    }
  }
  QVar24.m_data = (char *)description;
  QVar24.m_size = (qsizetype)&local_78;
  QJsonObject::value(QVar24);
  QJsonValue::swap((QJsonValue *)&local_58);
  QJsonValue::~QJsonValue((QJsonValue *)&local_78);
  bVar5 = QJsonValue::isUndefined((QJsonValue *)&local_58);
  if (!bVar5) {
    bVar5 = QJsonValue::isDouble((QJsonValue *)&local_58);
    if (bVar5) {
      SVar9 = QJsonValue::toInt((int)&local_58);
      this->m_orientation = SVar9;
    }
  }
  QJsonValue::~QJsonValue((QJsonValue *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSEmulatorScreen::initFromJsonObject(const QJsonObject &description)
{
    QJsonValue value;

    value = description.value("id"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_id = value.toInt();

    value = description.value("description"_L1);
    if (!value.isUndefined() && value.isString())
        m_description = value.toString();

    value = description.value("geometry"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject geometryObject = value.toObject();
        value = geometryObject.value("x"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setX(value.toInt());
        value = geometryObject.value("y"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setY(value.toInt());
        value = geometryObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setWidth(value.toInt());
        value = geometryObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setHeight(value.toInt());
    }

    value = description.value("depth"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_depth = value.toInt();

    value = description.value("format"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_format = static_cast<QImage::Format>(value.toInt());

    value = description.value("physicalSize"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject physicalSizeObject = value.toObject();
        value = physicalSizeObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setWidth(value.toInt());
        value = physicalSizeObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setHeight(value.toInt());
    }


    value = description.value("refreshRate"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_refreshRate = value.toDouble();

    value = description.value("nativeOrientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_nativeOrientation = static_cast<Qt::ScreenOrientation>(value.toInt());

    value = description.value("orientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_orientation = static_cast<Qt::ScreenOrientation>(value.toInt());
}